

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void matrixadd(float32 **a,float32 **b,int32 n)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = 0;
  uVar2 = 0;
  if (0 < n) {
    uVar2 = (ulong)(uint)n;
  }
  for (; uVar1 != uVar2; uVar1 = uVar1 + 1) {
    for (uVar3 = 0; (uint)n != uVar3; uVar3 = uVar3 + 1) {
      a[uVar1][uVar3] = (float32)((float)b[uVar1][uVar3] + (float)a[uVar1][uVar3]);
    }
  }
  return;
}

Assistant:

void
matrixadd(float32 ** a, float32 ** b, int32 n)
{
    int32 i, j;

    for (i = 0; i < n; ++i)
        for (j = 0; j < n; ++j)
            a[i][j] += b[i][j];
}